

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessQueriesTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Queries::ErrorsTest::isParameterName(ErrorsTest *this,GLenum maybe_pname)

{
  uint local_40;
  GLuint i;
  GLuint pnames_count;
  GLenum pnames [4];
  GLenum maybe_pname_local;
  ErrorsTest *this_local;
  
  _i = 0x886700008866;
  pnames[0] = 0x9194;
  pnames[1] = 0x82ea;
  local_40 = 0;
  while( true ) {
    if (3 < local_40) {
      return false;
    }
    if (maybe_pname == (&i)[local_40]) break;
    local_40 = local_40 + 1;
  }
  return true;
}

Assistant:

bool ErrorsTest::isParameterName(glw::GLenum maybe_pname)
{
	glw::GLenum pnames[]	 = { GL_QUERY_RESULT, GL_QUERY_RESULT_AVAILABLE, GL_QUERY_RESULT_NO_WAIT, GL_QUERY_TARGET };
	glw::GLuint pnames_count = sizeof(pnames) / sizeof(pnames[0]);

	for (glw::GLuint i = 0; i < pnames_count; ++i)
	{
		if (maybe_pname == pnames[i])
		{
			return true;
		}
	}

	return false;
}